

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *cols,size_t row)

{
  pointer pSVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  pointer pSVar5;
  string value;
  SummaryColumn col;
  char local_9a [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  Code local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  string *local_38;
  
  pSVar5 = (cols->super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (cols->super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = label;
  if (pSVar5 != pSVar1) {
    do {
      local_78 = local_68;
      pcVar2 = (pSVar5->label)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + (pSVar5->label)._M_string_length);
      local_58 = pSVar5->colour;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_50,&pSVar5->rows);
      local_98 = local_88;
      pcVar2 = local_50.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[row]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,
                 pcVar2 + local_50.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[row]._M_string_length);
      if (local_70 == 0) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((this->super_StreamingReporterBase).stream,(local_38->_M_dataplus)._M_p,
                            local_38->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        iVar3 = std::__cxx11::string::compare((char *)&local_98);
        poVar4 = (this->super_StreamingReporterBase).stream;
        if (iVar3 == 0) {
          local_9a[0] = '\0';
          Colour::use(BrightYellow);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"- none -",8);
          Colour::use(None);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_98,local_90);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar3 != 0) {
          poVar4 = (this->super_StreamingReporterBase).stream;
          local_9a[0] = '\0';
          Colour::use(FileName);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," | ",3);
          Colour::use(None);
          poVar4 = (this->super_StreamingReporterBase).stream;
          local_9a[1] = 0;
          Colour::use(local_58);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(char *)local_98,local_90);
          local_9a[0] = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_9a,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_78,local_70);
          Colour::use(None);
        }
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50);
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  local_78 = (long *)CONCAT71(local_78._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).stream,(char *)&local_78,1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryRow(std::string const &label, std::vector<SummaryColumn> const &cols, std::size_t row) {
                for (auto col : cols) {
                    std::string value = col.rows[row];
                    if (col.label.empty()) {
                        stream << label << ": ";
                        if (value != "0")
                            stream << value;
                        else
                            stream << Colour(Colour::Warning) << "- none -";
                    }
                    else if (value != "0") {
                        stream << Colour(Colour::LightGrey) << " | ";
                        stream << Colour(col.colour)
                            << value << ' ' << col.label;
                    }
                }
                stream << '\n';
            }